

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O3

int bcf_is_snp(bcf1_t *v)

{
  char *pcVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  
  bcf_unpack(v,1);
  uVar2 = *(uint *)&v->field_0x10 >> 0x10;
  uVar3 = 0;
  if (0xffff < *(uint *)&v->field_0x10) {
    uVar3 = uVar2 + (uVar2 == 0);
    uVar4 = 0;
    do {
      pcVar1 = (v->d).allele[uVar4];
      if ((pcVar1[1] != '\0') && (((pcVar1[1] != 'X' || (*pcVar1 != '<')) || (pcVar1[2] != '>')))) {
        uVar3 = (uint)uVar4;
        break;
      }
      uVar4 = uVar4 + 1;
    } while (uVar3 != uVar4);
  }
  return (int)(uVar3 == uVar2);
}

Assistant:

int bcf_is_snp(bcf1_t *v)
{
    int i;
    bcf_unpack(v, BCF_UN_STR);
    for (i = 0; i < v->n_allele; ++i)
    {
        if ( v->d.allele[i][1]==0 ) continue;

        // mpileup's <X> allele, see also below. This is not completely satisfactory,
        // a general library is here narrowly tailored to fit samtools.
        if ( v->d.allele[i][0]=='<' && v->d.allele[i][1]=='X' && v->d.allele[i][2]=='>' ) continue;

        break;
    }
    return i == v->n_allele;
}